

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O3

void CompareFeatTables(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,
                      byte *pNameTblB,byte *pNameTblT)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  wstring strT;
  wstring strB;
  wstring local_1d8;
  wstring local_1b8;
  int local_198;
  uint local_194;
  byte *local_190;
  byte *local_188;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  GrIStream *local_e0;
  ulong local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_190 = pNameTblB;
  local_188 = pNameTblT;
  iVar2 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  iVar3 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  if (iVar3 < 0x20001) {
    iVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    iVar5 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    uVar9 = (ushort)iVar4;
    uVar1 = (ushort)iVar5;
    if (uVar9 != uVar1) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"ERROR: Feat table - number of features","");
      OutputError(ec,ptcase,&local_d0,-1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    (*grstrmB->_vptr_GrIStream[4])(grstrmB);
    (*grstrmT->_vptr_GrIStream[4])(grstrmT);
    if (uVar1 < uVar9) {
      uVar9 = uVar1;
    }
    if (uVar9 != 0) {
      local_194 = (uint)uVar9;
      uVar8 = 0;
      uVar10 = 0;
      local_198 = iVar4;
      local_e0 = grstrmB;
      do {
        local_d8 = uVar8;
        if (iVar2 < 0x20000) {
          uVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
          uVar6 = uVar6 & 0xffff;
        }
        else {
          uVar6 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
        }
        if (iVar3 == 0x20000) {
          uVar7 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
        }
        else {
          uVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
          uVar7 = uVar7 & 0xffff;
        }
        if (uVar6 != uVar7) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"ERROR: Feat table - feature ID","");
          OutputError(ec,ptcase,&local_70,uVar10);
          grstrmB = local_e0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
        }
        uVar6 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
        iVar4 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
        if ((short)uVar6 != (short)iVar4) {
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_180,"ERROR: Feat table - feature","");
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_100,", number of settings","");
          OutputError(ec,ptcase,&local_180,uVar10,&local_100,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
        }
        if (0x1ffff < iVar2) {
          (*grstrmB->_vptr_GrIStream[2])(grstrmB);
        }
        if (iVar3 == 0x20000) {
          (*grstrmT->_vptr_GrIStream[2])(grstrmT);
        }
        (*grstrmB->_vptr_GrIStream[4])(grstrmB);
        (*grstrmT->_vptr_GrIStream[4])(grstrmT);
        iVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
        iVar5 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
        if ((short)iVar4 != (short)iVar5) {
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"ERROR: Feat table - feature","");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,", flags","");
          OutputError(ec,ptcase,&local_120,uVar10,&local_90,-1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
        }
        iVar4 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
        iVar5 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
        StringFromNameTable_abi_cxx11_(&local_1b8,local_190,0x409,(int)(short)iVar4);
        StringFromNameTable_abi_cxx11_(&local_1d8,local_188,0x409,(int)(short)iVar5);
        iVar4 = wcscmp(local_1b8._M_dataplus._M_p,local_1d8._M_dataplus._M_p);
        if (iVar4 != 0) {
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_140,"ERROR: Feat table - label for feature","");
          OutputError(ec,ptcase,&local_140,uVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity * 4 + 4
                         );
        }
        iVar4 = (int)local_d8;
        uVar7 = iVar4 + (uVar6 & 0xffff);
        uVar8 = (ulong)uVar7;
        uVar10 = uVar10 + 1;
      } while (local_194 != uVar10);
      if (((ushort)local_198 == uVar1) && (uVar7 != 0)) {
        iVar2 = 0;
        do {
          iVar3 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
          iVar5 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
          if ((short)iVar3 != (short)iVar5) {
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"ERROR: Feat table - value for setting","");
            OutputError(ec,ptcase,&local_b0,iVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
          }
          uVar10 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
          uVar7 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
          StringFromNameTable_abi_cxx11_(&local_1b8,local_190,0x409,uVar10 & 0xffff);
          StringFromNameTable_abi_cxx11_(&local_1d8,local_188,0x409,uVar7 & 0xffff);
          iVar3 = wcscmp(local_1b8._M_dataplus._M_p,local_1d8._M_dataplus._M_p);
          if (iVar3 != 0) {
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_160,"ERROR: Feat table - label for setting","");
            OutputError(ec,ptcase,&local_160,iVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != &local_160.field_2) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,
                            local_1d8.field_2._M_allocated_capacity * 4 + 4);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,
                            local_1b8.field_2._M_allocated_capacity * 4 + 4);
          }
          iVar2 = iVar2 + 1;
        } while (iVar4 + (uVar6 & 0xffff) != iVar2);
      }
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"ERROR: Feat table - unknown version number","");
    OutputError(ec,ptcase,&local_50,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void CompareFeatTables(int & ec, TestCase * ptcase, GrIStream & grstrmB, GrIStream & grstrmT,
	const gr::byte * pNameTblB, const gr::byte * pNameTblT)
{
	int fxdVersionB = ReadVersion(grstrmB);
	int fxdVersionT = ReadVersion(grstrmT);
    Assert(fxdVersionB <= kFeatVersion);
	if (fxdVersionT > kFeatVersion)
	{
		OutputError(ec, ptcase, "ERROR: Feat table - unknown version number");
		return;
	}
	
	//	number of features
	int cfeatB = grstrmB.ReadUShortFromFont();
	int cfeatT = grstrmT.ReadUShortFromFont();
	Assert(cfeatB <= kMaxFeatures);
	if (cfeatB != cfeatT)
		OutputError(ec, ptcase, "ERROR: Feat table - number of features");

	//	reserved
	grstrmB.ReadUShortFromFont();
	grstrmT.ReadUShortFromFont();
	grstrmB.ReadIntFromFont();
	grstrmT.ReadIntFromFont();
	
	int cfset = 0;
	int ifeat;
	for (ifeat = 0; ifeat < min(cfeatB, cfeatT); ifeat++)
	{
		//	ID
		featid nIdB, nIdT;
		if (fxdVersionB >= 0x00020000)
			nIdB = (unsigned int)grstrmB.ReadIntFromFont();
		else
			nIdB = grstrmB.ReadUShortFromFont();
		if (fxdVersionT >= 0x00020000)
			nIdT = (unsigned int)grstrmT.ReadIntFromFont();
		else
			nIdT = grstrmT.ReadUShortFromFont();
		if (nIdB != nIdT)
			OutputError(ec, ptcase, "ERROR: Feat table - feature ID", ifeat);

		//	number of settings
		data16 cfsetThis = grstrmB.ReadUShortFromFont();
		if (cfsetThis != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - feature", ifeat, ", number of settings");
		cfset += cfsetThis;

		if (fxdVersionB >= 0x00020000)
			grstrmB.ReadShortFromFont(); // pad bytes
		if (fxdVersionT >= 0x00020000)
			grstrmT.ReadShortFromFont();

		//	offset to settings list
		grstrmB.ReadIntFromFont();
		grstrmT.ReadIntFromFont();

		//	flags
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - feature", ifeat, ", flags");

		//	index into name table of UI label
		unsigned int nStrOffsetB = grstrmB.ReadShortFromFont();
		unsigned int nStrOffsetT = grstrmT.ReadShortFromFont();
		std::wstring strB = StringFromNameTable(pNameTblB, 1033, nStrOffsetB);
		std::wstring strT = StringFromNameTable(pNameTblT, 1033, nStrOffsetT);
		if (wcscmp(strB.c_str(), strT.c_str()) != 0)
			OutputError(ec, ptcase, "ERROR: Feat table - label for feature", ifeat);
	}

	if (cfeatB != cfeatT)
		return;

	// setttings
	for (int ifset = 0; ifset < cfset; ifset++)
	{
		if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - value for setting", ifset);

		// name table offsets
		unsigned int nStrOffsetB = grstrmB.ReadUShortFromFont();
		unsigned int nStrOffsetT = grstrmT.ReadUShortFromFont();
		std::wstring strB = StringFromNameTable(pNameTblB, 1033, nStrOffsetB);
		std::wstring strT = StringFromNameTable(pNameTblT, 1033, nStrOffsetT);
		if (wcscmp(strB.c_str(), strT.c_str()) != 0)
			OutputError(ec, ptcase, "ERROR: Feat table - label for setting", ifset);
	}
}